

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseDuration<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *pMVar1;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *pDVar2;
  bool bVar3;
  Status *x;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *pLVar4;
  int *piVar5;
  Field pFVar6;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  bool local_2e9;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1f8;
  size_t local_1e8;
  char *local_1e0;
  string_view local_1d8;
  size_t local_1c8;
  char *local_1c0;
  bool local_1b3;
  undefined1 auStack_1b0 [5];
  bool isNegative;
  char *local_1a8;
  _Optional_payload_base<int> local_1a0;
  optional<int> nanos;
  undefined1 local_188 [8];
  string_view rest;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  long local_130;
  int64_t secs;
  char *local_120;
  size_t sStack_118;
  string_view sec_digits;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  uchar local_e9;
  const_iterator pvStack_e8;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  char *local_d0;
  basic_string_view<char,_std::char_traits<char>_> *local_c8;
  string_view *__range3;
  size_t int_part_end;
  byte local_a1;
  undefined1 local_a0 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  int64_t kMaxSeconds;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *local_28;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc_local;
  JsonLexer *lex_local;
  Status *_status;
  
  local_28 = msg;
  msg_local = (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)desc;
  desc_local = (Desc<google::protobuf::json_internal::ParseProto2Descriptor> *)lex;
  lex_local = (JsonLexer *)this;
  bVar3 = JsonLexer::Peek(lex,kNull);
  pDVar2 = desc_local;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"null");
    JsonLocation::SourceLocation::current();
    JsonLexer::Expect((JsonLexer *)this,pDVar2,local_38._M_len,local_38._M_str);
  }
  else {
    str.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.path = (MessagePath *)0x4979cb9e00;
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_a0,(JsonLexer *)desc_local);
    local_a1 = 0;
    x = absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)local_a0);
    absl::lts_20240722::Status::Status((Status *)this,x);
    bVar3 = absl::lts_20240722::Status::ok((Status *)this);
    bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
    if (bVar3) {
      local_a1 = 1;
    }
    int_part_end._0_4_ = (uint)bVar3;
    if ((local_a1 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if ((uint)int_part_end == 0) {
      __range3 = (string_view *)0x0;
      pLVar4 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_a0);
      sVar7 = MaybeOwnedString::AsView(&pLVar4->value);
      local_d0 = sVar7._M_str;
      __begin3 = (const_iterator)sVar7._M_len;
      local_c8 = (basic_string_view<char,_std::char_traits<char>_> *)&__begin3;
      __end3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_c8);
      pvStack_e8 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_c8);
      for (; __end3 != pvStack_e8; __end3 = __end3 + 1) {
        local_e9 = *__end3;
        bVar3 = absl::lts_20240722::ascii_isdigit(local_e9);
        if ((!bVar3) && (local_e9 != '-')) break;
        __range3 = (string_view *)((long)&__range3->_M_len + 1);
      }
      if (__range3 == (string_view *)0x0) {
        pLVar4 = absl::lts_20240722::
                 StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)local_a0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_100,"duration must start with an integer");
        JsonLocation::SourceLocation::current();
        JsonLocation::Invalid((JsonLocation *)this,&pLVar4->loc,local_100._M_len,local_100._M_str);
        int_part_end._0_4_ = 1;
      }
      else {
        pLVar4 = absl::lts_20240722::
                 StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)local_a0);
        sVar7 = MaybeOwnedString::AsView(&pLVar4->value);
        local_120 = sVar7._M_str;
        secs = sVar7._M_len;
        local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)&secs,0,
                               (size_type)__range3);
        sec_digits._M_len = (size_t)local_148._M_str;
        sStack_118 = local_148._M_len;
        bVar3 = absl::lts_20240722::SimpleAtoi<long>(local_148,&local_130);
        if (bVar3) {
          if ((local_130 < 0x4979cb9e01) && (-0x4979cb9e01 < local_130)) {
            pLVar4 = absl::lts_20240722::
                     StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)local_a0);
            sVar7 = MaybeOwnedString::AsView(&pLVar4->value);
            nanos.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
                 = (_Optional_base<int,_true,_true>)sVar7._M_len;
            bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)&nanos,
                               (size_type)__range3,0xffffffffffffffff);
            rest._M_len = (size_t)bVar8._M_str;
            local_188 = (undefined1  [8])bVar8._M_len;
            local_1a0 = (_Optional_payload_base<int>)TakeNanosAndAdvance((string_view *)local_188);
            bVar3 = std::optional<int>::has_value((optional<int> *)&local_1a0);
            if (bVar3) {
              local_2e9 = true;
              if (-1 < local_130) {
                local_1c8 = sStack_118;
                local_1c0 = (char *)sec_digits._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_1d8,"-");
                sVar7._M_str = local_1c0;
                sVar7._M_len = local_1c8;
                local_2e9 = absl::lts_20240722::StartsWith(sVar7,local_1d8);
              }
              local_1b3 = local_2e9;
              if (local_2e9 != false) {
                piVar5 = std::optional<int>::operator*((optional<int> *)&local_1a0);
                *piVar5 = -*piVar5;
              }
              local_1e8 = (size_t)local_188;
              local_1e0 = (char *)rest._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1f8,"s");
              bVar8._M_str = local_1e0;
              bVar8._M_len = local_1e8;
              bVar3 = std::operator!=(bVar8,local_1f8);
              pMVar1 = msg_local;
              if (bVar3) {
                pLVar4 = absl::lts_20240722::
                         StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       *)local_a0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_208,"duration must end with a single \'s\'");
                JsonLocation::SourceLocation::current();
                JsonLocation::Invalid
                          ((JsonLocation *)this,&pLVar4->loc,local_208._M_len,local_208._M_str);
                int_part_end._0_4_ = 1;
              }
              else {
                JsonLocation::SourceLocation::current();
                pFVar6 = Proto2Descriptor::MustHaveField(pMVar1,1);
                ParseProto2Descriptor::SetInt64(pFVar6,local_28,local_130);
                pMVar1 = msg_local;
                JsonLocation::SourceLocation::current();
                pFVar6 = Proto2Descriptor::MustHaveField(pMVar1,2);
                pMVar1 = local_28;
                piVar5 = std::optional<int>::operator*((optional<int> *)&local_1a0);
                ParseProto2Descriptor::SetInt32(pFVar6,pMVar1,*piVar5);
                absl::lts_20240722::OkStatus();
                int_part_end._0_4_ = 1;
              }
            }
            else {
              pLVar4 = absl::lts_20240722::
                       StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     *)local_a0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1b0,
                         "duration had bad nanoseconds");
              JsonLocation::SourceLocation::current();
              JsonLocation::Invalid((JsonLocation *)this,&pLVar4->loc,_auStack_1b0,local_1a8);
              int_part_end._0_4_ = 1;
            }
          }
          else {
            pLVar4 = absl::lts_20240722::
                     StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)local_a0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_170,"duration out of range");
            JsonLocation::SourceLocation::current();
            JsonLocation::Invalid
                      ((JsonLocation *)this,&pLVar4->loc,local_170._M_len,local_170._M_str);
            int_part_end._0_4_ = 1;
          }
        }
        else {
          pLVar4 = absl::lts_20240722::
                   StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)local_a0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_158,"duration had bad seconds");
          JsonLocation::SourceLocation::current();
          JsonLocation::Invalid((JsonLocation *)this,&pLVar4->loc,local_158._M_len,local_158._M_str)
          ;
          int_part_end._0_4_ = 1;
        }
      }
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 *)local_a0);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseDuration(JsonLexer& lex, const Desc<Traits>& desc,
                           Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  constexpr int64_t kMaxSeconds = int64_t{3652500} * 86400;

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  size_t int_part_end = 0;
  for (char c : str->value.AsView()) {
    if (!absl::ascii_isdigit(c) && c != '-') {
      break;
    }
    ++int_part_end;
  }
  if (int_part_end == 0) {
    return str->loc.Invalid("duration must start with an integer");
  }

  absl::string_view sec_digits = str->value.AsView().substr(0, int_part_end);
  int64_t secs;
  if (!absl::SimpleAtoi(sec_digits, &secs)) {
    return str->loc.Invalid("duration had bad seconds");
  }

  if (secs > kMaxSeconds || secs < -kMaxSeconds) {
    return str->loc.Invalid("duration out of range");
  }

  absl::string_view rest = str->value.AsView().substr(int_part_end);
  auto nanos = TakeNanosAndAdvance(rest);
  if (!nanos.has_value()) {
    return str->loc.Invalid("duration had bad nanoseconds");
  }

  bool isNegative = (secs < 0) || absl::StartsWith(sec_digits, "-");
  if (isNegative) {
    *nanos *= -1;
  }

  if (rest != "s") {
    return str->loc.Invalid("duration must end with a single 's'");
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}